

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filelist-parser.c
# Opt level: O0

bc_slist_t * blogc_filelist_parse(char *src,size_t src_len)

{
  char c_00;
  char *data;
  bool bVar1;
  int local_34;
  _Bool is_last;
  char c;
  bc_string_t *pbStack_30;
  blogc_filelist_parser_state_t state;
  bc_string_t *line;
  bc_slist_t *rv;
  size_t current;
  size_t src_len_local;
  char *src_local;
  
  rv = (bc_slist_t *)0x0;
  line = (bc_string_t *)0x0;
  pbStack_30 = bc_string_new();
  local_34 = 1;
  do {
    while( true ) {
      if (src_len <= rv) {
        bc_string_free(pbStack_30,true);
        return (bc_slist_t *)line;
      }
      c_00 = src[(long)rv];
      bVar1 = rv == (bc_slist_t *)(src_len - 1);
      if (local_34 == 1) break;
      if (local_34 == 2) {
        if (((c_00 == '\r') || (c_00 == '\n')) || (bVar1)) {
          if (((bVar1) && (c_00 != '\r')) && (c_00 != '\n')) {
            bc_string_append_c(pbStack_30,c_00);
          }
          data = bc_str_strip(pbStack_30->str);
          line = (bc_string_t *)bc_slist_append((bc_slist_t *)line,data);
          bc_string_free(pbStack_30,false);
          pbStack_30 = bc_string_new();
          local_34 = 1;
        }
        else {
          bc_string_append_c(pbStack_30,c_00);
        }
      }
LAB_00102408:
      rv = (bc_slist_t *)((long)&rv->next + 1);
    }
    if (c_00 == '#') {
      for (; ((rv < src_len && (src[(long)rv] != '\r')) && (src[(long)rv] != '\n'));
          rv = (bc_slist_t *)((long)&rv->next + 1)) {
      }
      goto LAB_00102408;
    }
    if (((c_00 == ' ') || (c_00 == '\t')) || ((c_00 == '\r' || (c_00 == '\n')))) goto LAB_00102408;
    local_34 = 2;
  } while( true );
}

Assistant:

bc_slist_t*
blogc_filelist_parse(const char *src, size_t src_len)
{
    size_t current = 0;
    bc_slist_t *rv = NULL;
    bc_string_t *line = bc_string_new();
    blogc_filelist_parser_state_t state = LINE_START;

    while (current < src_len) {
        char c = src[current];
        bool is_last = current == src_len - 1;

        switch (state) {

            case LINE_START:
                if (c == '#') {
                    while (current < src_len) {
                        if (src[current] == '\r' || src[current] == '\n')
                            break;
                        current++;
                    }
                    break;
                }
                if (c == ' ' || c == '\t' || c == '\r' || c == '\n')
                    break;
                state = LINE;
                continue;

            case LINE:
                if (c == '\r' || c == '\n' || is_last) {
                    if (is_last && c != '\r' && c != '\n')
                        bc_string_append_c(line, c);
                    rv = bc_slist_append(rv, bc_str_strip(line->str));
                    bc_string_free(line, false);
                    line = bc_string_new();
                    state = LINE_START;
                    break;
                }
                bc_string_append_c(line, c);
                break;

        }

        current++;
    }

    bc_string_free(line, true);

    return rv;
}